

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testValidCrop2(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ConvolutionLayerParams *pCVar4;
  bool bVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion this;
  Type *this_00;
  CropLayerParams *this_01;
  ShapeConstraint *pSVar10;
  ShapeRange *pSVar11;
  size_t sVar12;
  ostream *poVar13;
  int iVar14;
  int iVar15;
  RangeValue RVar16;
  Model m1;
  NeuralNetworkShaper shaper;
  Result res;
  string local_110;
  RangeValue local_f0;
  Model local_e0;
  undefined1 local_b0 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  local_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&local_e0);
  if (local_e0.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_e0.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_e0.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_b0 + 0x10;
  local_b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar2) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  iVar15 = (pAVar9->shape_).total_size_;
  if ((pAVar9->shape_).current_size_ == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
  }
  iVar15 = (pAVar9->shape_).current_size_;
  iVar14 = iVar15 + 1;
  (pAVar9->shape_).current_size_ = iVar14;
  ((pAVar9->shape_).rep_)->elements[iVar15] = 1;
  iVar15 = (pAVar9->shape_).total_size_;
  if (iVar14 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
  }
  iVar15 = (pAVar9->shape_).current_size_;
  iVar14 = iVar15 + 1;
  (pAVar9->shape_).current_size_ = iVar14;
  ((pAVar9->shape_).rep_)->elements[iVar15] = 0xea;
  iVar15 = (pAVar9->shape_).total_size_;
  if (iVar14 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
  }
  iVar15 = (pAVar9->shape_).current_size_;
  (pAVar9->shape_).current_size_ = iVar15 + 1;
  ((pAVar9->shape_).rep_)->elements[iVar15] = 0x14c;
  if (local_e0.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_e0.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_e0.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"input2","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar2) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  iVar15 = (pAVar9->shape_).total_size_;
  if ((pAVar9->shape_).current_size_ == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
  }
  iVar15 = (pAVar9->shape_).current_size_;
  iVar14 = iVar15 + 1;
  (pAVar9->shape_).current_size_ = iVar14;
  ((pAVar9->shape_).rep_)->elements[iVar15] = 2;
  iVar15 = (pAVar9->shape_).total_size_;
  if (iVar14 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
  }
  iVar15 = (pAVar9->shape_).current_size_;
  iVar14 = iVar15 + 1;
  (pAVar9->shape_).current_size_ = iVar14;
  ((pAVar9->shape_).rep_)->elements[iVar15] = 10;
  iVar15 = (pAVar9->shape_).total_size_;
  if (iVar14 == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
  }
  iVar15 = (pAVar9->shape_).current_size_;
  (pAVar9->shape_).current_size_ = iVar15 + 1;
  ((pAVar9->shape_).rep_)->elements[iVar15] = 0xb;
  if (local_e0.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_e0.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_e0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar2) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  if (local_e0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_e0);
    local_e0._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_e0.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_e0.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input2");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  if (this_00->_oneof_case_[0] != 0xbe) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0xbe;
    this_01 = (CropLayerParams *)operator_new(0x38);
    CoreML::Specification::CropLayerParams::CropLayerParams(this_01);
    (this_00->layer_).crop_ = this_01;
  }
  pCVar4 = (this_00->layer_).convolution_;
  iVar15 = (pCVar4->kernelsize_).total_size_;
  if ((pCVar4->kernelsize_).current_size_ == iVar15) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar4->kernelsize_,iVar15 + 1);
  }
  iVar15 = (pCVar4->kernelsize_).current_size_;
  iVar14 = iVar15 + 1;
  (pCVar4->kernelsize_).current_size_ = iVar14;
  ((pCVar4->kernelsize_).rep_)->elements[iVar15] = 1;
  iVar15 = (pCVar4->kernelsize_).total_size_;
  if (iVar14 == iVar15) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar4->kernelsize_,iVar15 + 1);
  }
  iVar15 = (pCVar4->kernelsize_).current_size_;
  (pCVar4->kernelsize_).current_size_ = iVar15 + 1;
  ((pCVar4->kernelsize_).rep_)->elements[iVar15] = 2;
  CoreML::validate<(MLModelType)500>(&local_48,&local_e0);
  bVar5 = CoreML::Result::good(&local_48);
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe93);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    iVar15 = 1;
    std::ostream::flush();
    goto LAB_0018c13e;
  }
  CoreML::NeuralNetworkShaper::NeuralNetworkShaper((NeuralNetworkShaper *)local_b0,&local_e0,true);
  bVar5 = CoreML::NeuralNetworkShaper::isValid((NeuralNetworkShaper *)local_b0);
  if (bVar5) {
    paVar3 = &local_110.field_2;
    local_110._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"probs","");
    pSVar10 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_b0,&local_110);
    pSVar11 = CoreML::ShapeConstraint::channelRange(pSVar10);
    RVar16 = CoreML::ShapeRange::minimum(pSVar11);
    local_f0._val = RVar16._val;
    local_f0._isUnbound = RVar16._isUnbound;
    sVar12 = CoreML::RangeValue::value(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (sVar12 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,"shaper.shape(\"probs\").channelRange().minimum().value() == 1",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      goto LAB_0018c10f;
    }
    local_110._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"probs","");
    pSVar10 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_b0,&local_110);
    pSVar11 = CoreML::ShapeConstraint::channelRange(pSVar10);
    RVar16 = CoreML::ShapeRange::maximum(pSVar11);
    local_f0._val = RVar16._val;
    local_f0._isUnbound = RVar16._isUnbound;
    sVar12 = CoreML::RangeValue::value(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (sVar12 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,"shaper.shape(\"probs\").channelRange().maximum().value() == 1",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      goto LAB_0018c10f;
    }
    local_110._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"probs","");
    pSVar10 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_b0,&local_110);
    pSVar11 = CoreML::ShapeConstraint::heightRange(pSVar10);
    RVar16 = CoreML::ShapeRange::minimum(pSVar11);
    local_f0._val = RVar16._val;
    local_f0._isUnbound = RVar16._isUnbound;
    sVar12 = CoreML::RangeValue::value(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (sVar12 != 10) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe9b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,"shaper.shape(\"probs\").heightRange().minimum().value() == 10",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      goto LAB_0018c10f;
    }
    local_110._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"probs","");
    pSVar10 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_b0,&local_110);
    pSVar11 = CoreML::ShapeConstraint::heightRange(pSVar10);
    RVar16 = CoreML::ShapeRange::maximum(pSVar11);
    local_f0._val = RVar16._val;
    local_f0._isUnbound = RVar16._isUnbound;
    sVar12 = CoreML::RangeValue::value(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (sVar12 == 10) {
      local_110._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"probs","");
      pSVar10 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_b0,&local_110);
      pSVar11 = CoreML::ShapeConstraint::widthRange(pSVar10);
      RVar16 = CoreML::ShapeRange::minimum(pSVar11);
      local_f0._val = RVar16._val;
      local_f0._isUnbound = RVar16._isUnbound;
      sVar12 = CoreML::RangeValue::value(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar3) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if (sVar12 != 0xb) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe9e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"shaper.shape(\"probs\").widthRange().minimum().value() == 11",0x3a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13," was false, expected true.",0x1a);
        goto LAB_0018c27e;
      }
      local_110._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"probs","");
      pSVar10 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_b0,&local_110);
      pSVar11 = CoreML::ShapeConstraint::widthRange(pSVar10);
      RVar16 = CoreML::ShapeRange::maximum(pSVar11);
      local_f0._val = RVar16._val;
      local_f0._isUnbound = RVar16._isUnbound;
      sVar12 = CoreML::RangeValue::value(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar3) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      iVar15 = 0;
      if (sVar12 != 0xb) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe9f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"shaper.shape(\"probs\").widthRange().maximum().value() == 11",0x3a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13," was false, expected true.",0x1a);
        goto LAB_0018c27e;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe9c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,"shaper.shape(\"probs\").heightRange().maximum().value() == 10",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," was false, expected true.",0x1a);
LAB_0018c27e:
      iVar15 = 1;
      std::endl<char,std::char_traits<char>>(poVar13);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xe96);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"shaper.isValid()",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
LAB_0018c10f:
    std::ostream::put((char)poVar13);
    iVar15 = 1;
    std::ostream::flush();
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  ::~_Rb_tree(&local_78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               *)(local_b0 + 8));
LAB_0018c13e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_e0);
  return iVar15;
}

Assistant:

int testValidCrop2() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(234);
    shape->add_shape(332);

    auto *topIn2 = m1.mutable_description()->add_input();
    topIn2->set_name("input2");
    auto* shape2 = topIn2->mutable_type()->mutable_multiarraytype();
    shape2->add_shape(2);
    shape2->add_shape(10);
    shape2->add_shape(11);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *cropLayer = nn->add_layers();
    cropLayer->add_input("input");
    cropLayer->add_input("input2");
    cropLayer->add_output("probs");
    auto *params = cropLayer->mutable_crop();
    params->add_offset(1);
    params->add_offset(2);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    NeuralNetworkShaper shaper(m1);
    ML_ASSERT(shaper.isValid());

    ML_ASSERT(shaper.shape("probs").channelRange().minimum().value() == 1);
    ML_ASSERT(shaper.shape("probs").channelRange().maximum().value() == 1);

    ML_ASSERT(shaper.shape("probs").heightRange().minimum().value() == 10);
    ML_ASSERT(shaper.shape("probs").heightRange().maximum().value() == 10);

    ML_ASSERT(shaper.shape("probs").widthRange().minimum().value() == 11);
    ML_ASSERT(shaper.shape("probs").widthRange().maximum().value() == 11);

    return 0;
}